

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
* __thiscall
testing::internal::UnorderedElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
           *__return_storage_ptr__,UnorderedElementsAreMatcher *this)

{
  back_insert_iterator<std::vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>_>
  bVar1;
  UnorderedElementsAreMatcherImpl<std::vector<std::pair<std::__cxx11::string_const,pstore::extent<char>>,std::allocator<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>const&>
  *this_00;
  iterator first;
  iterator last;
  undefined1 local_30 [8];
  MatcherVec matchers;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  *this_local;
  
  matchers.
  super__Vector_base<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
  ::vector((vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
            *)local_30);
  std::
  vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
  ::reserve((vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
             *)local_30,2);
  bVar1 = std::
          back_inserter<std::vector<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>,std::allocator<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>>>>
                    ((vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
                      *)local_30);
  TransformTupleValues<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>,testing::internal::CastAndAppendTransform<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>,std::back_insert_iterator<std::vector<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>,std::allocator<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>>>>>
            (this,bVar1.container);
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<std::pair<std::__cxx11::string_const,pstore::extent<char>>,std::allocator<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>const&>
             *)operator_new(0x40);
  first = std::
          vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
          ::begin((vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
                   *)local_30);
  last = std::
         vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
         ::end((vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
                *)local_30);
  UnorderedElementsAreMatcherImpl<std::vector<std::pair<std::__cxx11::string_const,pstore::extent<char>>,std::allocator<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>*,std::vector<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>,std::allocator<testing::Matcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>>>>>
            (this_00,ExactMatch,
             (__normal_iterator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>_>
              )first._M_current,
             (__normal_iterator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>_>
              )last._M_current);
  Matcher<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
  ::Matcher(__return_storage_ptr__,
            (MatcherInterface<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
             *)this_00);
  std::
  vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
  ::~vector((vector<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>,_std::allocator<testing::Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&> > MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            UnorderedMatcherRequire::ExactMatch, matchers.begin(),
            matchers.end()));
  }